

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,ArrayNew *curr)

{
  Type *this_00;
  Literal *pLVar1;
  ulong initialSize;
  long lVar2;
  HeapType heapType;
  undefined1 auStack_168 [8];
  Field field;
  Literal local_140;
  undefined1 auStack_128 [8];
  Literals data;
  undefined1 local_e0 [8];
  Flow size;
  anon_union_16_6_1532cd5a_for_Literal_0 aStack_90;
  undefined8 uStack_80;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_78;
  pointer pLStack_60;
  char *local_58;
  undefined1 auStack_50 [8];
  Literal value;
  
  local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLStack_60 = (pointer)0x0;
  local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  aStack_90.func.super_IString.str._M_str = (char *)0x0;
  uStack_80 = 0;
  size.breakTo.super_IString.str._M_str = (char *)0x0;
  aStack_90.i64 = 0;
  local_58 = (char *)0x0;
  if (curr->init != (Expression *)0x0) {
    visit((Flow *)local_e0,this,curr->init);
    size.breakTo.super_IString.str._M_str = (char *)local_e0;
    ::wasm::Literal::operator=((Literal *)&aStack_90.func,(Literal *)&size);
    data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 =
         (int64_t)local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage;
    data.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    auStack_128 = (undefined1  [8])
                  local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                  .super__Vector_impl_data._M_start;
    local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_128);
    pLStack_60 = size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    local_58 = (char *)size.breakTo.super_IString.str._M_len;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    ::wasm::Literal::~Literal((Literal *)&size);
    if (local_58 != (char *)0x0) {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)size.breakTo.super_IString.str._M_str;
      ::wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,(Literal *)&aStack_90.func);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = (size_t)pLStack_60;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = local_58;
      goto LAB_001c3149;
    }
  }
  visit((Flow *)local_e0,this,curr->size);
  if (size.breakTo.super_IString.str._M_len == 0) {
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.type.id == 1) {
      visit(__return_storage_ptr__,this,curr->init);
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) {
        __assert_fail("init.breaking()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x74f,
                      "Flow wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayNew(ArrayNew *) [SubType = wasm::ModuleRunner]"
                     );
      }
    }
    else {
      this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.type;
      Type::getHeapType(this_00);
      value.type.id = (uintptr_t)this;
      ::wasm::HeapType::getArray();
      if ((char *)((long)local_e0 +
                  ((long)((long)size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                _M_impl.super__Vector_impl_data._M_start -
                         size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
                         ) >> 3) * -0x5555555555555555) != (char *)0x1) {
LAB_001c3173:
        __assert_fail("values.size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x52,"const Literal &wasm::Flow::getSingleValue()");
      }
      if (size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
          super_IString.str._M_str != (char *)0x2) {
        __assert_fail("type == Type::i32",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                      ,0x120,"int32_t wasm::Literal::geti32() const");
      }
      initialSize = (ulong)(uint)size.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      if (0x2aaaaa9 < initialSize) {
        (**(code **)(*(long *)value.type.id + 0x18))(value.type.id,"allocation failure");
      }
      SmallVector<wasm::Literal,_1UL>::SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)auStack_128,initialSize);
      if (curr->init == (Expression *)0x0) {
        ::wasm::Literal::makeZero((Type)auStack_50);
        if (initialSize != 0) {
          lVar2 = 0;
          do {
            pLVar1 = (Literal *)
                     ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18)
                     + lVar2);
            if (lVar2 == 0) {
              pLVar1 = (Literal *)&data;
            }
            ::wasm::Literal::operator=(pLVar1,(Literal *)auStack_50);
            lVar2 = lVar2 + 0x18;
          } while (initialSize * 0x18 != lVar2);
        }
      }
      else {
        Type::getHeapType(this_00);
        ::wasm::HeapType::getArray();
        auStack_168 = auStack_50;
        field.type.id = value.field_0.i64;
        if (size.breakTo.super_IString.str._M_str +
            ((long)local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 !=
            (char *)0x1) goto LAB_001c3173;
        ::wasm::Literal::Literal((Literal *)&field.packedType,(Literal *)&aStack_90.func);
        truncateForPacking((Literal *)auStack_50,
                           (ExpressionRunner<wasm::ModuleRunner> *)value.type.id,
                           (Literal *)&field.packedType,(Field *)auStack_168);
        ::wasm::Literal::~Literal((Literal *)&field.packedType);
        if (initialSize != 0) {
          lVar2 = 0;
          do {
            pLVar1 = (Literal *)
                     ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18)
                     + lVar2);
            if (lVar2 == 0) {
              pLVar1 = (Literal *)&data;
            }
            ::wasm::Literal::operator=(pLVar1,(Literal *)auStack_50);
            lVar2 = lVar2 + 0x18;
          } while (initialSize * 0x18 != lVar2);
        }
      }
      ::wasm::Literal::~Literal((Literal *)auStack_50);
      makeGCData(&local_140,(ExpressionRunner<wasm::ModuleRunner> *)value.type.id,
                 (Literals *)auStack_128,(Type)this_00->id);
      Flow::Flow(__return_storage_ptr__,&local_140);
      ::wasm::Literal::~Literal(&local_140);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      ::wasm::Literal::~Literal((Literal *)&data);
    }
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_e0;
    ::wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&size);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)size.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  ::wasm::Literal::~Literal((Literal *)&size);
LAB_001c3149:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_78);
  ::wasm::Literal::~Literal((Literal *)&aStack_90.func);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayNew(ArrayNew* curr) {
    NOTE_ENTER("ArrayNew");
    Flow init;
    if (!curr->isWithDefault()) {
      init = self()->visit(curr->init);
      if (init.breaking()) {
        return init;
      }
    }
    auto size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // visit the unreachable child, and stop there.
      auto init = self()->visit(curr->init);
      assert(init.breaking());
      return init;
    }
    auto heapType = curr->type.getHeapType();
    const auto& element = heapType.getArray().element;
    Index num = size.getSingleValue().geti32();
    if (num >= DataLimit) {
      hostLimit("allocation failure");
    }
    Literals data(num);
    if (curr->isWithDefault()) {
      auto zero = Literal::makeZero(element.type);
      for (Index i = 0; i < num; i++) {
        data[i] = zero;
      }
    } else {
      auto field = curr->type.getHeapType().getArray().element;
      auto value = truncateForPacking(init.getSingleValue(), field);
      for (Index i = 0; i < num; i++) {
        data[i] = value;
      }
    }
    return makeGCData(std::move(data), curr->type);
  }